

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

char * vstrdupf(char *fmt,__va_list_tag *args)

{
  int iVar1;
  char *__s;
  undefined8 uStack_48;
  va_list args2;
  int size;
  char *str;
  __va_list_tag *args_local;
  char *fmt_local;
  
  args2[0].overflow_arg_area = args->reg_save_area;
  uStack_48._0_4_ = args->gp_offset;
  uStack_48._4_4_ = args->fp_offset;
  args2[0]._0_8_ = args->overflow_arg_area;
  args_local = (__va_list_tag *)fmt;
  if (fmt == (char *)0x0) {
    args_local = (__va_list_tag *)0x108a68;
  }
  iVar1 = vsnprintf((char *)0x0,0,(char *)args_local,&uStack_48);
  __s = (char *)malloc((long)(iVar1 + 2));
  if (__s == (char *)0x0) {
    perror("malloc error");
    exit(1);
  }
  vsprintf(__s,(char *)args_local,args);
  return __s;
}

Assistant:

static char *
vstrdupf (const char *fmt, va_list args) {
    char *str;
    int size;
    va_list args2;
    va_copy(args2, args);
    if (!fmt)
        fmt = "";
    size = vsnprintf(NULL, 0, fmt, args2) + 2;
    str = malloc(size);
    if (!str) {
        perror("malloc error");
        exit(1);
    }
    vsprintf(str, fmt, args);
    va_end(args2);
    return str;
}